

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

TileJobsDec * get_dec_job_info(AV1DecTileMT *tile_mt_info)

{
  undefined8 *in_RDI;
  TileJobsDec *cur_job_info;
  TileJobsDec *local_10;
  
  local_10 = (TileJobsDec *)0x0;
  pthread_mutex_lock((pthread_mutex_t *)*in_RDI);
  if (*(int *)((long)in_RDI + 0x14) < *(int *)(in_RDI + 2)) {
    local_10 = (TileJobsDec *)(in_RDI[1] + (long)*(int *)((long)in_RDI + 0x14) * 0x10);
    *(int *)((long)in_RDI + 0x14) = *(int *)((long)in_RDI + 0x14) + 1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)*in_RDI);
  return local_10;
}

Assistant:

static TileJobsDec *get_dec_job_info(AV1DecTileMT *tile_mt_info) {
  TileJobsDec *cur_job_info = NULL;
#if CONFIG_MULTITHREAD
  pthread_mutex_lock(tile_mt_info->job_mutex);

  if (tile_mt_info->jobs_dequeued < tile_mt_info->jobs_enqueued) {
    cur_job_info = tile_mt_info->job_queue + tile_mt_info->jobs_dequeued;
    tile_mt_info->jobs_dequeued++;
  }

  pthread_mutex_unlock(tile_mt_info->job_mutex);
#else
  (void)tile_mt_info;
#endif
  return cur_job_info;
}